

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O1

void __thiscall
Assimp::SIBImporter::InternReadFile
          (SIBImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  uint32_t posB;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  undefined4 uVar6;
  iterator iVar3;
  _func_int **pp_Var4;
  aiScene *paVar7;
  void *__src;
  pointer pSVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  pointer puVar11;
  pointer puVar12;
  _Alloc_hider _Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  int iVar15;
  uint uVar16;
  ai_uint32 aVar17;
  uint uVar18;
  uint uVar19;
  undefined4 extraout_var;
  aiMaterial *this_00;
  aiMesh *paVar20;
  aiLight *paVar21;
  SIBChunk SVar22;
  SIBEdge *pSVar23;
  aiMatrix4x4t<float> *paVar24;
  Logger *this_01;
  ulong *puVar25;
  aiFace *paVar26;
  aiVector3D *paVar27;
  long lVar28;
  aiMaterial **__dest;
  aiMesh **ppaVar29;
  aiLight **ppaVar30;
  aiNode *this_02;
  aiNode **ppaVar31;
  aiNode *paVar32;
  uint *puVar33;
  aiMetadata *paVar34;
  aiString *paVar35;
  aiMetadataEntry *__s;
  undefined1 *puVar36;
  aiNode *paVar37;
  runtime_error *prVar38;
  aiLightSourceType aVar39;
  aiFace *paVar40;
  uint32_t uVar41;
  uint32_t *puVar42;
  ulong uVar43;
  uint uVar44;
  size_type __n;
  ulong uVar46;
  long lVar47;
  uint32_t uVar48;
  ulong uVar49;
  ulong uVar50;
  size_t __n_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  uint32_t prevFaceIdx;
  StreamReaderLE stream;
  float shiny;
  SIB sib;
  aiMaterial *defmtl;
  aiColor3D emis;
  aiColor3D ambi;
  aiVector3D uv;
  aiColor3D spec;
  aiColor3D diff;
  aiString name;
  aiString tex;
  aiString defname;
  ulong local_1018;
  aiVector3t<float> local_1000;
  float local_ff4;
  StreamReader<false,_false> local_ff0;
  aiVector3t<float> local_fb8;
  float local_fa8;
  float local_fa4;
  ulong local_fa0;
  ulong local_f98;
  ulong local_f90;
  ulong local_f88;
  aiScene *local_f80;
  pointer local_f78;
  ulong local_f70;
  ulong local_f68;
  float local_f5c;
  undefined1 local_f58 [16];
  void *local_f48;
  iterator iStack_f40;
  aiMaterial **local_f38;
  void *pvStack_f30;
  iterator local_f28;
  aiMesh **ppaStack_f20;
  aiLight **local_f18;
  iterator iStack_f10;
  aiLight **local_f08;
  vector<SIBObject,_std::allocator<SIBObject>_> vStack_f00;
  vector<SIBObject,_std::allocator<SIBObject>_> local_ee8;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  aiMaterial *local_eb0;
  undefined1 local_ea8 [8];
  undefined1 local_ea0 [28];
  float local_e84;
  float local_e80;
  float local_e7c;
  float local_e78;
  float local_e74;
  float local_e70;
  uint local_e6c;
  undefined1 local_e68 [12];
  float fStack_e5c;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  aiVector3t<float> local_e28;
  float *local_e18;
  float *local_e10;
  float *local_e08;
  aiMatrix4x4 *local_e00;
  undefined1 local_df8 [12];
  float fStack_dec;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  undefined1 local_db0 [24];
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  float local_d88;
  float local_d84;
  float fStack_d80;
  float fStack_d7c;
  float fStack_d78;
  float local_d74;
  uint32_t local_d70;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d68;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d50;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d08;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_cf0;
  pointer local_cd8;
  pointer local_cd0;
  _Rb_tree_node_base local_cb8;
  size_t local_c98;
  undefined1 local_c90 [5];
  undefined1 auStack_c8b [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c88;
  aiVector3t<float> local_c80 [84];
  aiMatrix4x4 local_88c;
  size_t local_848;
  size_t local_840;
  undefined1 local_838 [1028];
  aiString local_434;
  SIBChunk *pSVar45;
  
  _local_c90 = (pointer)local_c80;
  local_f80 = pScene;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"rb","");
  iVar15 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,_local_c90);
  StreamReader<false,_false>::StreamReader
            (&local_ff0,(IOStream *)CONCAT44(extraout_var,iVar15),false);
  if ((aiVector3t<float> *)_local_c90 != local_c80) {
    operator_delete(_local_c90);
  }
  if (((int)local_ff0.end - (int)local_ff0.current & 0xfffffff0U) == 0) {
    prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c90,
                   "SIB file is either empty or corrupt: ",pFile);
    std::runtime_error::runtime_error(prVar38,(string *)local_c90);
    *(undefined ***)prVar38 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar38,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f08 = (aiLight **)0x0;
  vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f18 = (aiLight **)0x0;
  iStack_f10._M_current = (aiLight **)0x0;
  local_f28._M_current = (aiMesh **)0x0;
  ppaStack_f20 = (aiMesh **)0x0;
  local_f38 = (aiMaterial **)0x0;
  pvStack_f30 = (void *)0x0;
  local_f48 = (void *)0x0;
  iStack_f40._M_current = (aiMaterial **)0x0;
  local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  local_eb0 = this_00;
  _local_c90 = (pointer)local_c80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"DefaultMaterial","");
  _Var13._M_p = _local_c90;
  __n_00 = 0x3ff;
  if (((ulong)local_c88._M_pi & 0xfffffc00) == 0) {
    __n_00 = (ulong)local_c88._M_pi & 0xffffffff;
  }
  local_434.length = (ai_uint32)__n_00;
  memcpy(local_434.data,_local_c90,__n_00);
  local_434.data[__n_00] = '\0';
  if ((aiVector3t<float> *)_Var13._M_p != local_c80) {
    operator_delete(_Var13._M_p);
  }
  aiMaterial::AddProperty(local_eb0,&local_434,"?mat.name",0,0);
  if (iStack_f40._M_current == local_f38) {
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_f48,iStack_f40,&local_eb0);
  }
  else {
    *iStack_f40._M_current = local_eb0;
    iStack_f40._M_current = iStack_f40._M_current + 1;
  }
  if (((int)local_ff0.limit - (int)local_ff0.current & 0xfffffff8U) != 0) {
    local_e00 = &local_88c;
    local_e08 = &local_88c.a2;
    local_e10 = &local_88c.b3;
    local_e18 = &local_88c.c4;
    do {
      local_ea8 = (undefined1  [8])ReadChunk(&local_ff0);
      uVar44 = ((int)local_ff0.current - (int)local_ff0.buffer) + local_ea8._4_4_;
      pSVar45 = (SIBChunk *)(ulong)uVar44;
      local_e6c = StreamReader<false,_false>::SetReadLimit(&local_ff0,uVar44);
      if ((int)local_ea8._0_4_ < 0x4c474854) {
        if (local_ea8._0_4_ != 0x47525053) {
          if (local_ea8._0_4_ == 0x48454144) {
            uVar44 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
            if (uVar44 - 3 < 0xfffffffe) {
              prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
              _local_c90 = (pointer)local_c80;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c90,"SIB: Unsupported file version.","");
              std::runtime_error::runtime_error(prVar38,(string *)local_c90);
              *(undefined ***)prVar38 = &PTR__runtime_error_0081d260;
              __cxa_throw(prVar38,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            if (local_ea8._0_4_ != 0x494e5354) goto LAB_0061ea45;
            _local_c90 = _local_c90 & 0xffffff0000000000;
            memset(local_c90 + 5,0x1b,0x3ff);
            local_88c.a1 = 1.0;
            local_e08[0] = 0.0;
            local_e08[1] = 0.0;
            *(undefined8 *)(local_e08 + 2) = 0;
            local_88c.b2 = 1.0;
            local_e10[0] = 0.0;
            local_e10[1] = 0.0;
            *(undefined8 *)(local_e10 + 2) = 0;
            local_88c.c3 = 1.0;
            local_e18[0] = 0.0;
            local_e18[1] = 0.0;
            *(undefined8 *)(local_e18 + 2) = 0;
            local_88c.d4 = 1.0;
            if (((int)local_ff0.limit - (int)local_ff0.current & 0xfffffff8U) == 0) {
              uVar43 = 0;
            }
            else {
              uVar43 = 0;
              do {
                SVar22 = ReadChunk(&local_ff0);
                local_db0._0_4_ = SVar22.Tag;
                local_db0._4_4_ = SVar22.Size;
                uVar10 = local_db0._4_4_;
                uVar44 = ((int)local_ff0.current - (int)local_ff0.buffer) + local_db0._4_4_;
                pSVar45 = (SIBChunk *)(ulong)uVar44;
                uVar44 = StreamReader<false,_false>::SetReadLimit(&local_ff0,uVar44);
                if ((int)local_db0._0_4_ < 0x50494e46) {
                  if ((float)local_db0._0_4_ == 13.517901) {
                    ReadAxis(local_e00,&local_ff0);
                  }
                  else if ((float)local_db0._0_4_ != 805.223) {
                    if ((float)local_db0._0_4_ == 845108.56) {
                      uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                      uVar43 = (ulong)uVar16;
                    }
                    else {
LAB_0061e358:
                      UnknownChunk((StreamReaderLE *)local_db0,pSVar45);
                    }
                  }
                }
                else if ((float)local_db0._0_4_ != 1.3509401e+10) {
                  if ((float)local_db0._0_4_ == 8.8188335e+11) {
                    local_f5c = StreamReader<false,_false>::Get<float>(&local_ff0);
                    fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    fVar53 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_f58._0_4_ = fVar53;
                    fVar53 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_ec8 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_ff4 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    fVar54 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_f68 = CONCAT44(local_f68._4_4_,fVar54);
                    fVar54 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_f88 = CONCAT44(local_f88._4_4_,fVar54);
                    fVar54 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_f90 = CONCAT44(local_f90._4_4_,fVar54);
                    fVar54 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_f70 = CONCAT44(local_f70._4_4_,fVar54);
                    fVar54 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_f78 = (pointer)CONCAT44(local_f78._4_4_,fVar54);
                    fVar54 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_f98 = CONCAT44(local_f98._4_4_,fVar54);
                    fVar54 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_fa0 = CONCAT44(local_fa0._4_4_,fVar54);
                    local_fa4 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_fa8 = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_ea0._24_4_ = StreamReader<false,_false>::Get<float>(&local_ff0);
                    local_e70 = fVar53 * local_88c.a4 +
                                (float)local_f58._0_4_ * local_88c.a3 +
                                local_f5c * local_88c.a1 + fVar52 * local_88c.a2;
                    local_e74 = (float)local_f88 * local_88c.a4 +
                                (float)local_f68 * local_88c.a3 +
                                local_ec8 * local_88c.a1 + local_ff4 * local_88c.a2;
                    local_e78 = (float)local_f98 * local_88c.a4 +
                                local_f78._0_4_ * local_88c.a3 +
                                (float)local_f90 * local_88c.a1 + (float)local_f70 * local_88c.a2;
                    local_e7c = local_88c.a4 * (float)local_ea0._24_4_ +
                                local_88c.a3 * local_fa8 +
                                local_88c.a1 * (float)local_fa0 + local_88c.a2 * local_fa4;
                    local_e80 = fVar53 * local_88c.b4 +
                                (float)local_f58._0_4_ * local_88c.b3 +
                                local_f5c * local_88c.b1 + fVar52 * local_88c.b2;
                    local_e84 = (float)local_f88 * local_88c.b4 +
                                (float)local_f68 * local_88c.b3 +
                                local_ec8 * local_88c.b1 + local_ff4 * local_88c.b2;
                    fVar54 = (float)local_f70 * local_88c.b2;
                    fVar62 = (float)local_f90 * local_88c.b1;
                    fVar63 = (float)local_f98 * local_88c.b4;
                    local_88c.b4 = local_88c.b4 * (float)local_ea0._24_4_ +
                                   local_88c.b3 * local_fa8 +
                                   local_88c.b1 * (float)local_fa0 + local_88c.b2 * local_fa4;
                    fVar64 = fVar53 * local_88c.c4;
                    fVar57 = local_ec8 * local_88c.c1;
                    fVar65 = (float)local_f88 * local_88c.c4;
                    fVar55 = (float)local_f70 * local_88c.c2;
                    fVar66 = (float)local_f90 * local_88c.c1;
                    fVar67 = (float)local_f98 * local_88c.c4;
                    local_88c.c4 = local_88c.c4 * (float)local_ea0._24_4_ +
                                   local_88c.c3 * local_fa8 +
                                   local_88c.c1 * (float)local_fa0 + local_88c.c2 * local_fa4;
                    fVar53 = fVar53 * local_88c.d4;
                    fVar59 = local_ec8 * local_88c.d1;
                    fVar60 = (float)local_f88 * local_88c.d4;
                    fVar61 = (float)local_f70 * local_88c.d2;
                    fVar58 = (float)local_f90 * local_88c.d1;
                    fVar56 = (float)local_f98 * local_88c.d4;
                    local_88c.d4 = (float)local_ea0._24_4_ * local_88c.d4 +
                                   local_fa8 * local_88c.d3 +
                                   (float)local_fa0 * local_88c.d1 + local_fa4 * local_88c.d2;
                    local_88c.a1 = local_e70;
                    local_88c.a2 = local_e74;
                    local_88c.a3 = local_e78;
                    local_88c.a4 = local_e7c;
                    local_88c.b1 = local_e80;
                    local_88c.b2 = local_e84;
                    local_88c.b3 = fVar63 + local_f78._0_4_ * local_88c.b3 + fVar62 + fVar54;
                    local_88c.c1 = fVar64 + (float)local_f58._0_4_ * local_88c.c3 +
                                            local_f5c * local_88c.c1 + fVar52 * local_88c.c2;
                    local_88c.c2 = fVar65 + (float)local_f68 * local_88c.c3 +
                                            fVar57 + local_ff4 * local_88c.c2;
                    local_88c.c3 = fVar67 + local_f78._0_4_ * local_88c.c3 + fVar66 + fVar55;
                    local_88c.d1 = fVar53 + (float)local_f58._0_4_ * local_88c.d3 +
                                            local_f5c * local_88c.d1 + fVar52 * local_88c.d2;
                    local_88c.d2 = fVar60 + (float)local_f68 * local_88c.d3 +
                                            fVar59 + local_ff4 * local_88c.d2;
                    local_88c.d3 = fVar56 + local_f78._0_4_ * local_88c.d3 + fVar58 + fVar61;
                  }
                  else {
                    if ((float)local_db0._0_4_ != 8.858588e+11) goto LAB_0061e358;
                    ReadString((aiString *)local_838,&local_ff0,(uint)uVar10 >> 1);
                    uVar49 = local_838._0_8_ & 0xffffffff;
                    local_c90._0_4_ = local_838._0_4_;
                    memcpy(local_c90 + 4,local_838 + 4,uVar49);
                    local_c90[uVar49 + 4] = 0;
                  }
                }
                StreamReader<false,_false>::SetPtr
                          (&local_ff0,
                           (int8_t *)
                           ((ulong)(uint)((int)local_ff0.limit - (int)local_ff0.buffer) +
                           CONCAT44(local_ff0.buffer._4_4_,(int)local_ff0.buffer)));
                StreamReader<false,_false>::SetReadLimit(&local_ff0,uVar44);
              } while (((int)local_ff0.limit - (int)local_ff0.current & 0xfffffff8U) != 0);
            }
            uVar49 = ((long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x3aef6ca970586723;
            if (uVar49 < uVar43 || uVar49 - uVar43 == 0) {
              prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_838._0_8_ = local_838 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_838,"SIB: Invalid shape index.","");
              std::runtime_error::runtime_error(prVar38,(string *)local_838);
              *(undefined ***)prVar38 = &PTR__runtime_error_0081d260;
              __cxa_throw(prVar38,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            local_848 = vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar43].meshIdx;
            local_840 = vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar43].meshCount;
            std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                      (&local_ee8,(value_type *)local_c90);
          }
        }
      }
      else if ((int)local_ea8._0_4_ < 0x53484150) {
        if (local_ea8._0_4_ == 0x4c474854) {
          paVar21 = (aiLight *)operator_new(0x46c);
          (paVar21->mName).length = 0;
          (paVar21->mName).data[0] = '\0';
          memset((paVar21->mName).data + 1,0x1b,0x3ff);
          paVar21->mType = aiLightSource_UNDEFINED;
          (paVar21->mPosition).x = 0.0;
          (paVar21->mPosition).y = 0.0;
          (paVar21->mPosition).z = 0.0;
          (paVar21->mDirection).x = 0.0;
          (paVar21->mDirection).y = 0.0;
          *(undefined8 *)&(paVar21->mDirection).z = 0;
          (paVar21->mUp).x = 0.0;
          (paVar21->mUp).y = 0.0;
          *(undefined8 *)&(paVar21->mUp).z = 0;
          paVar21->mAttenuationLinear = 1.0;
          paVar21->mAttenuationQuadratic = 0.0;
          (paVar21->mColorDiffuse).r = 0.0;
          (paVar21->mColorDiffuse).g = 0.0;
          (paVar21->mColorDiffuse).b = 0.0;
          (paVar21->mColorSpecular).r = 0.0;
          (paVar21->mColorSpecular).g = 0.0;
          *(undefined8 *)&(paVar21->mColorSpecular).b = 0;
          (paVar21->mColorAmbient).g = 0.0;
          (paVar21->mColorAmbient).b = 0.0;
          paVar21->mAngleInnerCone = 6.2831855;
          paVar21->mAngleOuterCone = 6.2831855;
          (paVar21->mSize).x = 0.0;
          (paVar21->mSize).y = 0.0;
          local_838._0_8_ = paVar21;
          while (((int)local_ff0.limit - (int)local_ff0.current & 0xfffffff8U) != 0) {
            SVar22 = ReadChunk(&local_ff0);
            local_db0._0_4_ = SVar22.Tag;
            local_db0._4_4_ = SVar22.Size;
            uVar10 = local_db0._4_4_;
            uVar44 = ((int)local_ff0.current - (int)local_ff0.buffer) + local_db0._4_4_;
            pSVar45 = (SIBChunk *)(ulong)uVar44;
            uVar44 = StreamReader<false,_false>::SetReadLimit(&local_ff0,uVar44);
            uVar9 = local_838._0_8_;
            if ((float)local_db0._0_4_ == 8.858588e+11) {
              ReadString((aiString *)local_c90,&local_ff0,(uint)uVar10 >> 1);
              uVar9 = local_838._0_8_;
              uVar43 = (ulong)_local_c90 & 0xffffffff;
              ((aiString *)local_838._0_8_)->length = local_c90._0_4_;
              memcpy(((aiString *)local_838._0_8_)->data,local_c90 + 4,uVar43);
              ((aiString *)uVar9)->data[uVar43] = '\0';
            }
            else if ((float)local_db0._0_4_ == 5.407366e+07) {
              uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
              aVar39 = aiLightSource_UNDEFINED;
              if (uVar16 < 3) {
                aVar39 = *(aiLightSourceType *)(&DAT_007050cc + (ulong)uVar16 * 4);
              }
              *(aiLightSourceType *)(uVar9 + 0x404) = aVar39;
              fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
              ((aiVector3D *)(uVar9 + 0x408))->x = fVar52;
              fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
              ((aiVector3D *)(uVar9 + 0x408))->y = fVar52;
              fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
              ((aiVector3D *)(uVar9 + 0x408))->z = fVar52;
              fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
              ((aiVector3D *)(uVar9 + 0x414))->x = fVar52;
              fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
              ((aiVector3D *)(uVar9 + 0x414))->y = fVar52;
              fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
              ((aiVector3D *)(uVar9 + 0x414))->z = fVar52;
              ReadColor((StreamReaderLE *)local_c90);
              ((aiColor3D *)(uVar9 + 0x438))->r = (ai_real)local_c90._0_4_;
              ((aiColor3D *)(uVar9 + 0x438))->g = stack0xfffffffffffff374;
              ((aiColor3D *)(uVar9 + 0x438))->b = local_c88._M_pi._0_4_;
              ReadColor((StreamReaderLE *)local_c90);
              ((aiColor3D *)(uVar9 + 0x450))->r = (ai_real)local_c90._0_4_;
              ((aiColor3D *)(uVar9 + 0x450))->g = stack0xfffffffffffff374;
              ((aiColor3D *)(uVar9 + 0x450))->b = local_c88._M_pi._0_4_;
              ReadColor((StreamReaderLE *)local_c90);
              ((aiColor3D *)(uVar9 + 0x444))->r = (ai_real)local_c90._0_4_;
              ((aiColor3D *)(uVar9 + 0x444))->g = stack0xfffffffffffff374;
              ((aiColor3D *)(uVar9 + 0x444))->b = local_c88._M_pi._0_4_;
              fVar53 = StreamReader<false,_false>::Get<float>(&local_ff0);
              fVar54 = StreamReader<false,_false>::Get<float>(&local_ff0);
              fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
              *(float *)(uVar9 + 0x42c) = fVar52;
              fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
              *(float *)(uVar9 + 0x430) = fVar52;
              fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
              *(float *)(uVar9 + 0x434) = fVar52;
              fVar52 = 1e-05;
              if (1e-05 <= fVar53) {
                fVar52 = fVar53;
              }
              local_f58._0_4_ = 1.0 / fVar52;
              fVar52 = powf(0.99,1.0 / fVar52);
              fVar53 = acosf(fVar52);
              fVar52 = powf(0.01,(float)local_f58._0_4_);
              fVar55 = acosf(fVar52);
              fVar52 = fVar54 * 0.017453292;
              if (fVar55 <= fVar54 * 0.017453292) {
                fVar52 = fVar55;
              }
              fVar54 = fVar52;
              if (fVar53 <= fVar52) {
                fVar54 = fVar53;
              }
              *(float *)(uVar9 + 0x45c) = fVar54;
              *(float *)(uVar9 + 0x460) = fVar52;
            }
            else {
              UnknownChunk((StreamReaderLE *)local_db0,pSVar45);
            }
            StreamReader<false,_false>::SetPtr
                      (&local_ff0,
                       (int8_t *)
                       ((ulong)(uint)((int)local_ff0.limit - (int)local_ff0.buffer) +
                       CONCAT44(local_ff0.buffer._4_4_,(int)local_ff0.buffer)));
            StreamReader<false,_false>::SetReadLimit(&local_ff0,uVar44);
          }
          if (iStack_f10._M_current == local_f08) {
            std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                      ((vector<aiLight*,std::allocator<aiLight*>> *)&local_f18,iStack_f10,
                       (aiLight **)local_838);
          }
          else {
            *iStack_f10._M_current = (aiLight *)local_838._0_8_;
            iStack_f10._M_current = iStack_f10._M_current + 1;
          }
        }
        else if (local_ea8._0_4_ == 0x4d415452) {
          ReadColor((StreamReaderLE *)local_db0);
          ReadColor((StreamReaderLE *)local_e68);
          ReadColor((StreamReaderLE *)local_df8);
          ReadColor((StreamReaderLE *)local_ea0);
          uVar44 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
          local_fb8.x = (float)uVar44;
          uVar44 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
          ReadString((aiString *)local_c90,&local_ff0,uVar44 >> 1);
          uVar44 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
          ReadString((aiString *)local_838,&local_ff0,uVar44 >> 1);
          paVar20 = (aiMesh *)operator_new(0x10);
          aiMaterial::aiMaterial((aiMaterial *)paVar20);
          local_1000._0_8_ = paVar20;
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)paVar20,local_db0,0xc,"$clr.diffuse",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)local_1000._0_8_,local_e68,0xc,"$clr.ambient",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)local_1000._0_8_,local_df8,0xc,"$clr.specular",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)local_1000._0_8_,local_ea0,0xc,"$clr.emissive",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)local_1000._0_8_,&local_fb8,4,"$mat.shininess",0,0,aiPTI_Float);
          aiMaterial::AddProperty
                    ((aiMaterial *)local_1000._0_8_,(aiString *)local_c90,"?mat.name",0,0);
          if (local_838._0_4_ != 0) {
            aiMaterial::AddProperty
                      ((aiMaterial *)local_1000._0_8_,(aiString *)local_838,"$tex.file",1,0);
            aiMaterial::AddProperty
                      ((aiMaterial *)local_1000._0_8_,(aiString *)local_838,"$tex.file",3,0);
          }
          if (iStack_f40._M_current == local_f38) {
            std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
            _M_realloc_insert<aiMaterial*const&>
                      ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_f48,iStack_f40,
                       (aiMaterial **)&local_1000);
          }
          else {
            *iStack_f40._M_current = (aiMaterial *)local_1000._0_8_;
            iStack_f40._M_current = iStack_f40._M_current + 1;
          }
        }
        else {
LAB_0061ea45:
          UnknownChunk((StreamReaderLE *)local_ea8,pSVar45);
        }
      }
      else if (local_ea8._0_4_ == 0x53484150) {
        local_db0._0_4_ = 1.0;
        local_db0._4_4_ = 0.0;
        local_db0._8_4_ = 0.0;
        local_db0._12_4_ = 0.0;
        local_db0._16_4_ = 0.0;
        local_db0._20_4_ = 1.0;
        uStack_d98 = (int8_t *)0x0;
        uStack_d90 = (int8_t *)0x0;
        local_d88 = 1.0;
        local_d84 = 0.0;
        fStack_d80 = 0.0;
        fStack_d7c = 0.0;
        fStack_d78 = 0.0;
        local_d74 = 1.0;
        local_cb8._M_color = _S_red;
        local_cb8._M_parent = (_Base_ptr)0x0;
        memset(&local_d68,0,0xa8);
        local_cb8._M_left = &local_cb8;
        local_c98 = 0;
        local_1018._0_4_ = 0.0;
        local_838._0_8_ = local_838._0_8_ & 0xffffff0000000000;
        local_cb8._M_right = local_cb8._M_left;
        memset(local_838 + 5,0x1b,0x3ff);
        if (((int)local_ff0.limit - (int)local_ff0.current & 0xfffffff8U) != 0) {
          local_1018 = 0;
          do {
            local_e68._0_8_ = ReadChunk(&local_ff0);
            uVar10 = local_e68._4_4_;
            uVar44 = ((int)local_ff0.current - (int)local_ff0.buffer) + local_e68._4_4_;
            pSVar45 = (SIBChunk *)(ulong)uVar44;
            uVar44 = StreamReader<false,_false>::SetReadLimit(&local_ff0,uVar44);
            aVar17 = (ai_uint32)local_1018;
            if ((int)local_e68._0_4_ < 0x46545653) {
              if ((int)local_e68._0_4_ < 0x46414353) {
                if ((int)local_e68._0_4_ < 0x45435253) {
                  if ((float)local_e68._0_4_ == 13.517901) {
                    ReadAxis((aiMatrix4x4 *)local_db0,&local_ff0);
                  }
                  else if ((float)local_e68._0_4_ != 805.223) goto LAB_0061f3f1;
                }
                else if ((float)local_e68._0_4_ == 3125.1453) {
                  while ((int)local_ff0.limit != (int)local_ff0.current) {
                    uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                    uVar43 = (ulong)uVar16;
                    uVar49 = ((long)local_cd0 - (long)local_cd8 >> 2) * -0x5555555555555555;
                    if (uVar49 < uVar43 || uVar49 - uVar43 == 0) {
                      local_838._0_4_ = aVar17;
                      prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
                      _local_c90 = (pointer)local_c80;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_c90,"SIB: Invalid edge index.","");
                      std::runtime_error::runtime_error(prVar38,(string *)local_c90);
                      *(undefined ***)prVar38 = &PTR__runtime_error_0081d260;
                      __cxa_throw(prVar38,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_cd8[uVar43].creased = true;
                  }
                }
                else {
                  if ((float)local_e68._0_4_ != 3140.4578) goto LAB_0061f3f1;
                  while ((int)local_ff0.limit != (int)local_ff0.current) {
                    uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                    uVar18 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                    GetEdge((SIBMesh *)local_db0,uVar16,uVar18);
                  }
                }
              }
              else if ((int)local_e68._0_4_ < 0x46414d41) {
                if ((float)local_e68._0_4_ == 12368.831) {
                  if ((int)local_ff0.limit == (int)local_ff0.current) {
                    uVar43 = 0;
                  }
                  else {
                    uVar43 = 0;
                    do {
                      uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                      lVar47 = (long)local_d20.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_d20.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      lVar28 = lVar47 >> 2;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                                (&local_d20,lVar28 + (ulong)(uVar16 * 3) + 1);
                      *(uint *)((long)local_d20.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar47) = uVar16;
                      puVar33 = local_d20.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar28 + 1;
                      if (local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        local_c90._0_4_ = (float)lVar28;
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_d08,
                                   (iterator)
                                   local_d08.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c90);
                      }
                      else {
                        *local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish = (uint)(float)lVar28;
                        local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_d08.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      _local_c90 = (pointer)((ulong)(uint)stack0xfffffffffffff374 << 0x20);
                      if (local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_cf0,
                                   (iterator)
                                   local_cf0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,(uint *)local_c90);
                      }
                      else {
                        *local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish = 0;
                        local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_cf0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      for (; uVar16 != 0; uVar16 = uVar16 - 1) {
                        uVar18 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                        uVar49 = ((long)local_d68.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_d68.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                 -0x5555555555555555;
                        if (uVar49 < uVar18 || uVar49 - uVar18 == 0) {
                          local_838._0_4_ = aVar17;
                          prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
                          _local_c90 = (pointer)local_c80;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_c90,"Vertex index is out of range.","");
                          std::runtime_error::runtime_error(prVar38,(string *)local_c90);
                          *(undefined ***)prVar38 = &PTR__runtime_error_0081d260;
                          __cxa_throw(prVar38,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        *puVar33 = uVar18;
                        uVar18 = (uint)uVar43;
                        puVar33[1] = uVar18;
                        puVar33[2] = uVar18;
                        puVar33 = puVar33 + 3;
                        uVar43 = (ulong)(uVar18 + 1);
                      }
                    } while ((int)local_ff0.limit != (int)local_ff0.current);
                  }
                  _local_c90 = (pointer)0x0;
                  local_c88._M_pi = local_c88._M_pi & 0xffffffff00000000;
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                            (&local_d50,uVar43,(value_type *)local_c90);
                  _local_c90 = (pointer)0x0;
                  local_c88._M_pi = local_c88._M_pi & 0xffffffff00000000;
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                            (&local_d38,uVar43,(value_type *)local_c90);
                  local_d70 = (uint32_t)uVar43;
                }
                else if ((float)local_e68._0_4_ != 12370.081) goto LAB_0061f3f1;
              }
              else if ((float)local_e68._0_4_ == 12371.313) {
                uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                uVar43 = (ulong)uVar16;
                uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                uVar16 = uVar16 + 1;
                if ((int)local_ff0.limit != (int)local_ff0.current) {
                  do {
                    uVar18 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                    uVar19 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                    if ((uint)uVar43 < uVar18) {
                      do {
                        if ((ulong)((long)local_cf0.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_cf0.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar43)
                        {
                          local_838._0_4_ = aVar17;
                          prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
                          _local_c90 = (pointer)local_c80;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_c90,"Invalid face index.","");
                          std::runtime_error::runtime_error(prVar38,(string *)local_c90);
                          *(undefined ***)prVar38 = &PTR__runtime_error_0081d260;
                          __cxa_throw(prVar38,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar43] = uVar16;
                        uVar43 = uVar43 + 1;
                      } while (uVar18 != uVar43);
                    }
                    uVar16 = uVar19 + 1;
                    uVar43 = (ulong)uVar18;
                  } while ((int)local_ff0.limit != (int)local_ff0.current);
                }
                if (uVar43 < (ulong)((long)local_cf0.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_cf0.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 2)) {
                  uVar18 = (uint)uVar43;
                  do {
                    uVar18 = uVar18 + 1;
                    local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar43] = uVar16;
                    uVar43 = (ulong)uVar18;
                  } while (uVar43 < (ulong)((long)local_cf0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_cf0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2));
                }
              }
              else if ((float)local_e68._0_4_ != 13138.33) goto LAB_0061f3f1;
            }
            else if ((int)local_e68._0_4_ < 0x534e414d) {
              if ((int)local_e68._0_4_ < 0x4d495250) {
                if ((float)local_e68._0_4_ == 13589.581) {
                  while ((int)local_ff0.limit != (int)local_ff0.current) {
                    uVar16 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                    uVar18 = StreamReader<false,_false>::Get<unsigned_int>(&local_ff0);
                    if ((ulong)((long)local_d08.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_d08.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) <=
                        (ulong)uVar16) {
                      local_838._0_4_ = aVar17;
                      prVar38 = (runtime_error *)__cxa_allocate_exception(0x10);
                      _local_c90 = (pointer)local_c80;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_c90,"Invalid face index.","");
                      std::runtime_error::runtime_error(prVar38,(string *)local_c90);
                      *(undefined ***)prVar38 = &PTR__runtime_error_0081d260;
                      __cxa_throw(prVar38,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    if (uVar18 != 0) {
                      puVar33 = local_d20.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                                (ulong)(local_d08.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar16] + 1) + 2;
                      do {
                        uVar16 = *puVar33;
                        fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
                        local_d38.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16].x = fVar52;
                        fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
                        local_d38.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16].y = fVar52;
                        puVar33 = puVar33 + 3;
                        uVar18 = uVar18 - 1;
                      } while (uVar18 != 0);
                    }
                  }
                }
                else if ((float)local_e68._0_4_ != 840997.0) goto LAB_0061f3f1;
              }
              else if (((float)local_e68._0_4_ != 2.1110093e+08) &&
                      ((float)local_e68._0_4_ != 1.3509401e+10)) {
LAB_0061f3f1:
                UnknownChunk((StreamReaderLE *)local_e68,pSVar45);
              }
            }
            else if ((int)local_e68._0_4_ < 0x564d4952) {
              if ((float)local_e68._0_4_ == 8.858588e+11) {
                ReadString((aiString *)local_c90,&local_ff0,(uint)uVar10 >> 1);
                local_1018 = (ulong)_local_c90 & 0xffffffff;
                memcpy(local_838 + 4,local_c90 + 4,local_1018);
                local_838[local_1018 + 4] = 0;
              }
              else if ((float)local_e68._0_4_ != 3.716442e+12) goto LAB_0061f3f1;
            }
            else if ((float)local_e68._0_4_ != 5.64287e+13) {
              if ((float)local_e68._0_4_ != 5.7814903e+13) goto LAB_0061f3f1;
              std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                        (&local_d68,(ulong)(uint)uVar10 / 0xc);
              if (0xb < (uint)uVar10) {
                lVar28 = 0;
                do {
                  fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
                  *(float *)((long)&(local_d68.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->x + lVar28) =
                       fVar52;
                  fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
                  *(float *)((long)&(local_d68.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->y + lVar28) =
                       fVar52;
                  fVar52 = StreamReader<false,_false>::Get<float>(&local_ff0);
                  *(float *)((long)&(local_d68.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->z + lVar28) =
                       fVar52;
                  lVar28 = lVar28 + 0xc;
                } while ((ulong)((uint)uVar10 / 0xc << 2) * 3 != lVar28);
              }
            }
            StreamReader<false,_false>::SetPtr
                      (&local_ff0,
                       (int8_t *)
                       ((ulong)(uint)((int)local_ff0.limit - (int)local_ff0.buffer) +
                       CONCAT44(local_ff0.buffer._4_4_,(int)local_ff0.buffer)));
            StreamReader<false,_false>::SetReadLimit(&local_ff0,uVar44);
          } while (((int)local_ff0.limit - (int)local_ff0.current & 0xfffffff8U) != 0);
        }
        local_838._0_4_ = (float)local_1018;
        if ((long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
            (long)local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_cf0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
          __assert_fail("smesh.faceStart.size() == smesh.mtls.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SIB/SIBImporter.cpp"
                        ,0x238,"void ReadShape(SIB *, StreamReaderLE *)");
        }
        if (local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar28 = (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          lVar47 = 0;
          do {
            uVar43 = (ulong)local_d08.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar47];
            uVar44 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar43];
            if (uVar44 != 0) {
              puVar42 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar43 + 1;
              uVar41 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [uVar43 + (ulong)(uVar44 * 3 - 3) + 1];
              do {
                uVar48 = *puVar42;
                pSVar23 = GetEdge((SIBMesh *)local_db0,uVar41,uVar48);
                if (pSVar23->faceA == 0xffffffff) {
LAB_0061f541:
                  pSVar23->faceA = (uint32_t)lVar47;
                }
                else if (pSVar23->faceB == 0xffffffff) {
                  pSVar23 = (SIBEdge *)&pSVar23->faceB;
                  goto LAB_0061f541;
                }
                puVar42 = puVar42 + 3;
                uVar44 = uVar44 - 1;
                uVar41 = uVar48;
              } while (uVar44 != 0);
            }
            lVar47 = lVar47 + 1;
          } while (lVar47 != lVar28 + (ulong)(lVar28 == 0));
        }
        puVar12 = local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        puVar11 = local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __n = (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_c90,__n,
                   (allocator_type *)local_e68);
        if (puVar12 != puVar11) {
          local_fa0 = __n + (__n == 0);
          uVar43 = 0;
          do {
            uVar49 = (ulong)local_d08.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar43];
            uVar50 = (ulong)local_d20.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar49];
            if (uVar50 == 0) {
              fVar53 = 0.0;
              fVar54 = 0.0;
              fVar52 = 0.0;
            }
            else {
              puVar33 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                        uVar49 + (uVar50 * 3 - 3 & 0xffffffff) + 1;
              fVar52 = 0.0;
              uVar46 = 0;
              fVar54 = 0.0;
              fVar53 = 0.0;
              do {
                uVar44 = *puVar33;
                puVar33 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          uVar49 + (uVar46 & 0xffffffff) + 1;
                uVar16 = *puVar33;
                fVar53 = fVar53 + (local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar44].y *
                                   local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar16].z -
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].y *
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar44].z);
                fVar54 = fVar54 + (local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar44].z *
                                   local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar16].x -
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].z *
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar44].x);
                fVar52 = fVar52 + (local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar44].x *
                                   local_d68.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar16].y -
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].x *
                                  local_d68.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar44].y);
                uVar46 = uVar46 + 3;
              } while (uVar50 * 3 != uVar46);
            }
            *(float *)(_local_c90 + uVar43 * 0xc) = fVar53;
            *(float *)(_local_c90 + uVar43 * 0xc + 4) = fVar54;
            *(float *)(_local_c90 + uVar43 * 0xc + 8) = fVar52;
            uVar43 = uVar43 + 1;
          } while (uVar43 != local_fa0);
          uVar43 = 0;
          do {
            local_f70 = (ulong)local_d20.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [local_d08.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar43]];
            if (local_f70 != 0) {
              local_f78 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          (ulong)local_d08.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar43] + 1;
              uVar49 = 0;
              local_f98 = uVar43;
              do {
                uVar41 = local_f78[(uint)((int)uVar49 * 3)];
                local_f90 = (ulong)local_f78[(int)uVar49 * 3 + 1];
                uVar43 = 0;
                uVar50 = local_f98 & 0xffffffff;
                local_f88 = uVar49;
                do {
                  fVar52 = 0.0;
                  local_f58._0_4_ = 0.0;
                  local_ec8 = 0.0;
                  local_ff4 = (float)uVar50;
                  local_1018 = uVar50;
                  local_f68 = uVar43;
                  while( true ) {
                    fVar53 = (float)uVar50;
                    local_f58 = ZEXT416((uint)(*(float *)(_local_c90 + uVar50 * 0xc) +
                                              (float)local_f58._0_4_));
                    fVar52 = fVar52 + *(float *)(_local_c90 + uVar50 * 0xc + 8);
                    uVar43 = (ulong)local_d08.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar50];
                    uVar44 = local_d20.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar43];
                    fStack_ec4 = local_ec8;
                    fStack_ec0 = local_ec8;
                    fStack_ebc = local_ec8;
                    if (uVar44 == 0) {
                      fVar54 = -NAN;
                      local_ec8 = local_ec8 + *(float *)(_local_c90 + uVar50 * 0xc + 4);
                    }
                    else {
                      puVar42 = local_d20.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar43 + 1;
                      uVar48 = local_d20.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start
                               [uVar43 + (ulong)(uVar44 * 3 - 3) + 1];
                      local_ec8 = local_ec8 + *(float *)(_local_c90 + uVar50 * 0xc + 4);
                      fVar55 = -NAN;
                      do {
                        posB = *puVar42;
                        fVar54 = fVar55;
                        if ((uVar48 == uVar41) || (posB == uVar41)) {
                          pSVar23 = GetEdge((SIBMesh *)local_db0,uVar48,posB);
                          fVar56 = (float)pSVar23->faceA;
                          fVar57 = (float)pSVar23->faceB;
                          if ((((fVar56 == fVar53) || (fVar57 == fVar53)) &&
                              (pSVar23->creased == false)) &&
                             (((fVar56 == fVar53 || (fVar56 == (float)local_1018)) ||
                              (fVar54 = fVar56, fVar56 == -NAN)))) {
                            fVar54 = fVar57;
                            if (fVar57 == -NAN) {
                              fVar54 = fVar55;
                            }
                            if (fVar57 == (float)local_1018) {
                              fVar54 = fVar55;
                            }
                            if (fVar57 == fVar53) {
                              fVar54 = fVar55;
                            }
                          }
                        }
                        puVar42 = puVar42 + 3;
                        uVar44 = uVar44 - 1;
                        uVar48 = posB;
                        fVar55 = fVar54;
                      } while (uVar44 != 0);
                    }
                    fVar56 = local_ec8;
                    fVar55 = (float)local_f58._0_4_;
                    if (fVar54 != local_ff4 && fVar54 != -NAN) {
                      local_1018._0_4_ = fVar53;
                    }
                    local_1018 = (ulong)(uint)(float)local_1018;
                    if (fVar54 == local_ff4 || fVar54 == -NAN) break;
                    uVar50 = (ulong)(uint)fVar54;
                  }
                  uVar43 = (ulong)((int)local_f68 + 1);
                } while ((int)local_f68 == 0);
                fVar53 = fVar52 * fVar52 +
                         (float)local_f58._0_4_ * (float)local_f58._0_4_ + local_ec8 * local_ec8;
                if (fVar53 < 0.0) {
                  fVar53 = sqrtf(fVar53);
                }
                else {
                  fVar53 = SQRT(fVar53);
                }
                if (1e-09 < fVar53) {
                  fVar53 = 1.0 / fVar53;
                  fVar55 = (float)local_f58._0_4_ * fVar53;
                  fVar56 = local_ec8 * fVar53;
                  fVar52 = fVar52 * fVar53;
                }
                local_d50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_f90].x = fVar55;
                local_d50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_f90].y = fVar56;
                local_d50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_f90].z = fVar52;
                uVar49 = local_f88 + 1;
                uVar43 = local_f98;
              } while (uVar49 != local_f70);
            }
            uVar43 = uVar43 + 1;
          } while (uVar43 != local_fa0);
        }
        if ((aiVector3t<float> *)_local_c90 != (aiVector3t<float> *)0x0) {
          operator_delete(_local_c90);
        }
        local_e68._4_4_ = local_db0._4_4_;
        local_e68._0_4_ = local_db0._0_4_;
        unique0x100022d9 =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(local_db0._12_4_,local_db0._8_4_);
        local_e58 = (int8_t *)CONCAT44(local_db0._20_4_,local_db0._16_4_);
        uStack_e40 = (int8_t *)CONCAT44(local_d84,local_d88);
        fStack_e34 = fStack_d7c;
        local_e38 = fStack_d80;
        fStack_e2c = local_d74;
        fStack_e30 = fStack_d78;
        local_e48 = uStack_d90;
        uStack_e50 = uStack_d98;
        aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_e68);
        local_dd8 = local_e48;
        local_de8 = local_e58;
        local_df8._0_8_ = local_e68._0_8_;
        local_dc8 = local_e38;
        fStack_dc4 = fStack_e34;
        fStack_dc0 = fStack_e30;
        fStack_dbc = fStack_e2c;
        uStack_dd0 = (int8_t *)((ulong)uStack_e40 & 0xffffffff);
        uStack_de0 = (int8_t *)((ulong)uStack_e50 & 0xffffffff);
        stack0xfffffffffffff210 = stack0xfffffffffffff1a0 & 0xffffffff;
        paVar24 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_df8);
        fVar52 = paVar24->b1;
        paVar24->b1 = paVar24->a2;
        paVar24->a2 = fVar52;
        fVar52 = paVar24->c1;
        paVar24->c1 = paVar24->a3;
        paVar24->a3 = fVar52;
        fVar52 = paVar24->c2;
        paVar24->c2 = paVar24->b3;
        paVar24->b3 = fVar52;
        fVar52 = paVar24->d1;
        paVar24->d1 = paVar24->a4;
        paVar24->a4 = fVar52;
        fVar52 = paVar24->d2;
        paVar24->d2 = paVar24->b4;
        paVar24->b4 = fVar52;
        fVar52 = paVar24->d3;
        paVar24->d3 = paVar24->c4;
        paVar24->c4 = fVar52;
        std::vector<TempMesh,_std::allocator<TempMesh>_>::vector
                  ((vector<TempMesh,_std::allocator<TempMesh>_> *)local_ea0,
                   (long)iStack_f40._M_current - (long)local_f48 >> 3,(allocator_type *)local_c90);
        if (local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar43 = 0;
          do {
            puVar33 = local_d20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      local_d08.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar43];
            uVar50 = (ulong)local_cf0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar43];
            uVar49 = ((long)(local_ea0._8_8_ - local_ea0._0_8_) >> 5) * -0x5555555555555555;
            if (uVar49 < uVar50 || uVar49 - uVar50 == 0) {
              this_01 = DefaultLogger::get();
              uVar50 = 0;
              Logger::error(this_01,"SIB: Face material index is invalid.");
            }
            p_Var51 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_ea0._0_8_ + uVar50 * 6 * 0x10);
            local_c88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            uVar44 = *puVar33;
            _local_c90 = (pointer)CONCAT44((int)((ulong)_local_c90 >> 0x20),uVar44);
            local_c88._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__((ulong)uVar44 << 2);
            if (uVar44 != 0) {
              puVar33 = puVar33 + 1;
              uVar49 = 0;
              do {
                *(int *)((long)&(local_c88._M_pi)->_vptr__Sp_counted_base + uVar49 * 4) =
                     (int)((ulong)(*(long *)&p_Var51->_M_use_count -
                                  (long)p_Var51->_vptr__Sp_counted_base) >> 2) * -0x55555555;
                uVar1 = local_d68.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar33].x;
                uVar5 = local_d68.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[*puVar33].y;
                fVar52 = local_d68.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[*puVar33].z;
                uVar2 = local_d50.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[puVar33[1]].x;
                uVar6 = local_d50.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start[puVar33[1]].y;
                fVar53 = local_d50.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[puVar33[1]].z;
                local_e28.x = local_d38.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar33[2]].x;
                local_e28.y = local_d38.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar33[2]].y;
                local_e28.z = local_d38.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[puVar33[2]].z;
                local_1000.z = fVar52 * (float)uStack_e40 +
                               (float)uVar1 * (float)local_e48 + (float)uVar5 * local_e48._4_4_ +
                               uStack_e40._4_4_;
                local_1000._0_8_ =
                     CONCAT44((float)uStack_e50 * fVar52 +
                              (float)local_e58 * (float)uVar1 + local_e58._4_4_ * (float)uVar5 +
                              uStack_e50._4_4_,
                              (float)local_e68._8_4_ * fVar52 +
                              (float)local_e68._0_4_ * (float)uVar1 +
                              (float)local_e68._4_4_ * (float)uVar5 + fStack_e5c);
                local_fb8.z = fVar53 * (float)uStack_dd0 +
                              (float)uVar2 * (float)local_dd8 + (float)uVar6 * local_dd8._4_4_ +
                              uStack_dd0._4_4_;
                local_fb8.y = (float)uStack_de0 * fVar53 +
                              (float)local_de8 * (float)uVar2 + local_de8._4_4_ * (float)uVar6 +
                              uStack_de0._4_4_;
                local_fb8.x = (float)local_df8._8_4_ * fVar53 +
                              (float)local_df8._0_4_ * (float)uVar2 +
                              (float)local_df8._4_4_ * (float)uVar6 + fStack_dec;
                iVar3._M_current = *(aiVector3t<float> **)&p_Var51->_M_use_count;
                if (iVar3._M_current == (aiVector3t<float> *)p_Var51[1]._vptr__Sp_counted_base) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)p_Var51,
                             iVar3,&local_1000);
                }
                else {
                  (iVar3._M_current)->z = local_1000.z;
                  *(undefined8 *)iVar3._M_current = local_1000._0_8_;
                  *(long *)&p_Var51->_M_use_count = *(long *)&p_Var51->_M_use_count + 0xc;
                }
                iVar3._M_current = (aiVector3t<float> *)p_Var51[2]._vptr__Sp_counted_base;
                if (iVar3._M_current == *(aiVector3t<float> **)&p_Var51[2]._M_use_count) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                             &p_Var51[1]._M_use_count,iVar3,&local_fb8);
                }
                else {
                  (iVar3._M_current)->z = local_fb8.z;
                  (iVar3._M_current)->x = local_fb8.x;
                  (iVar3._M_current)->y = local_fb8.y;
                  p_Var51[2]._vptr__Sp_counted_base =
                       (_func_int **)((long)p_Var51[2]._vptr__Sp_counted_base + 0xc);
                }
                iVar3._M_current = *(aiVector3t<float> **)&p_Var51[3]._M_use_count;
                if (iVar3._M_current == (aiVector3t<float> *)p_Var51[4]._vptr__Sp_counted_base) {
                  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                  _M_realloc_insert<aiVector3t<float>const&>
                            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                             (p_Var51 + 3),iVar3,&local_e28);
                }
                else {
                  (iVar3._M_current)->z = local_e28.z;
                  (iVar3._M_current)->x = local_e28.x;
                  (iVar3._M_current)->y = local_e28.y;
                  *(long *)&p_Var51[3]._M_use_count = *(long *)&p_Var51[3]._M_use_count + 0xc;
                }
                uVar49 = uVar49 + 1;
                puVar33 = puVar33 + 3;
              } while (uVar49 < ((ulong)_local_c90 & 0xffffffff));
            }
            std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                      ((vector<aiFace,_std::allocator<aiFace>_> *)&p_Var51[4]._M_use_count,
                       (value_type *)local_c90);
            if (local_c88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              operator_delete__(local_c88._M_pi);
            }
            uVar43 = (ulong)((int)uVar43 + 1);
          } while (uVar43 < (ulong)((long)local_d08.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d08.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2));
        }
        _local_c90 = _local_c90 & 0xffffff0000000000;
        memset(local_c90 + 5,0x1b,0x3ff);
        local_88c.a1 = 1.0;
        local_e08[0] = 0.0;
        local_e08[1] = 0.0;
        *(undefined8 *)(local_e08 + 2) = 0;
        local_88c.b2 = 1.0;
        local_e10[0] = 0.0;
        local_e10[1] = 0.0;
        *(undefined8 *)(local_e10 + 2) = 0;
        local_88c.c3 = 1.0;
        local_e18[0] = 0.0;
        local_e18[1] = 0.0;
        *(undefined8 *)(local_e18 + 2) = 0;
        local_88c.d4 = 1.0;
        uVar10 = local_838._0_4_;
        uVar43 = local_838._0_8_ & 0xffffffff;
        local_c90._0_4_ = local_838._0_4_;
        memcpy(local_c90 + 4,local_838 + 4,uVar43);
        local_c90[uVar43 + 4] = 0;
        local_e00->d1 = fStack_d80;
        local_e00->d2 = fStack_d7c;
        local_e00->d3 = fStack_d78;
        local_e00->d4 = local_d74;
        local_e00->c1 = (float)uStack_d90;
        local_e00->c2 = uStack_d90._4_4_;
        local_e00->c3 = local_d88;
        local_e00->c4 = local_d84;
        local_e00->b1 = (float)local_db0._16_4_;
        local_e00->b2 = (float)local_db0._20_4_;
        local_e00->b3 = (float)uStack_d98;
        local_e00->b4 = uStack_d98._4_4_;
        local_e00->a1 = (float)local_db0._0_4_;
        local_e00->a2 = (float)local_db0._4_4_;
        local_e00->a3 = (float)local_db0._8_4_;
        local_e00->a4 = (float)local_db0._12_4_;
        local_848 = (long)local_f28._M_current - (long)pvStack_f30 >> 3;
        if (local_ea0._8_8_ != local_ea0._0_8_) {
          uVar49 = 0;
          do {
            uVar9 = local_ea0._0_8_;
            if (*(_func_int ***)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (local_ea0._0_8_ + (uVar49 * 6 + 4) * 0x10))->_M_use_count !=
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (local_ea0._0_8_ + (uVar49 * 6 + 5) * 0x10))->_vptr__Sp_counted_base) {
              paVar20 = (aiMesh *)operator_new(0x520);
              p_Var51 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar9 + uVar49 * 6 * 0x10);
              paVar20->mPrimitiveTypes = 0;
              paVar20->mNumVertices = 0;
              paVar20->mNumFaces = 0;
              memset(&paVar20->mVertices,0,0xcc);
              paVar20->mBones = (aiBone **)0x0;
              paVar20->mMaterialIndex = 0;
              (paVar20->mName).length = 0;
              (paVar20->mName).data[0] = '\0';
              memset((paVar20->mName).data + 1,0x1b,0x3ff);
              paVar20->mNumAnimMeshes = 0;
              paVar20->mAnimMeshes = (aiAnimMesh **)0x0;
              paVar20->mMethod = 0;
              (paVar20->mAABB).mMin.x = 0.0;
              (paVar20->mAABB).mMin.y = 0.0;
              (paVar20->mAABB).mMin.z = 0.0;
              (paVar20->mAABB).mMax.x = 0.0;
              (paVar20->mAABB).mMax.y = 0.0;
              (paVar20->mAABB).mMax.z = 0.0;
              memset(paVar20->mColors,0,0xa0);
              (paVar20->mName).length = uVar10;
              local_1000._0_8_ = paVar20;
              memcpy((paVar20->mName).data,local_838 + 4,uVar43);
              (paVar20->mName).data[uVar43] = '\0';
              uVar50 = (long)p_Var51[5]._vptr__Sp_counted_base - *(long *)&p_Var51[4]._M_use_count
                       >> 4;
              paVar20->mNumFaces = (uint)uVar50;
              uVar50 = uVar50 & 0xffffffff;
              puVar25 = (ulong *)operator_new__(uVar50 * 0x10 + 8);
              *puVar25 = uVar50;
              paVar26 = (aiFace *)(puVar25 + 1);
              if (uVar50 != 0) {
                paVar40 = paVar26;
                do {
                  paVar40->mNumIndices = 0;
                  paVar40->mIndices = (uint *)0x0;
                  paVar40 = paVar40 + 1;
                } while (paVar40 != paVar26 + uVar50);
              }
              paVar20->mFaces = paVar26;
              lVar47 = *(long *)&p_Var51->_M_use_count - (long)p_Var51->_vptr__Sp_counted_base;
              lVar28 = lVar47 >> 0x3f;
              uVar50 = (lVar47 / 6 + lVar28 >> 1) - lVar28;
              uVar44 = (uint)uVar50;
              paVar20->mNumVertices = uVar44;
              uVar50 = (uVar50 & 0xffffffff) * 0xc;
              paVar27 = (aiVector3D *)operator_new__(uVar50);
              if (uVar44 != 0) {
                memset(paVar27,0,((uVar50 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar20->mVertices = paVar27;
              paVar27 = (aiVector3D *)operator_new__(uVar50);
              if (uVar44 != 0) {
                memset(paVar27,0,((uVar50 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar20->mNormals = paVar27;
              uVar44 = paVar20->mNumVertices;
              uVar50 = (ulong)uVar44 * 0xc;
              paVar27 = (aiVector3D *)operator_new__(uVar50);
              if (uVar44 == 0) {
                paVar20->mTextureCoords[0] = paVar27;
                paVar20->mNumUVComponents[0] = 2;
                paVar20->mMaterialIndex = (uint)uVar49;
              }
              else {
                memset(paVar27,0,((uVar50 - 0xc) / 0xc) * 0xc + 0xc);
                paVar20->mTextureCoords[0] = paVar27;
                paVar20->mNumUVComponents[0] = 2;
                paVar20->mMaterialIndex = (uint)uVar49;
                lVar28 = 0;
                uVar50 = 0;
                do {
                  pp_Var4 = p_Var51->_vptr__Sp_counted_base;
                  paVar27 = paVar20->mVertices;
                  *(undefined4 *)((long)&paVar27->z + lVar28) =
                       *(undefined4 *)((long)pp_Var4 + lVar28 + 8);
                  *(undefined8 *)((long)&paVar27->x + lVar28) =
                       *(undefined8 *)((long)pp_Var4 + lVar28);
                  lVar47 = *(long *)&p_Var51[1]._M_use_count;
                  paVar27 = paVar20->mNormals;
                  *(undefined4 *)((long)&paVar27->z + lVar28) = *(undefined4 *)(lVar47 + lVar28 + 8)
                  ;
                  *(undefined8 *)((long)&paVar27->x + lVar28) = *(undefined8 *)(lVar47 + lVar28);
                  pp_Var4 = p_Var51[3]._vptr__Sp_counted_base;
                  paVar27 = paVar20->mTextureCoords[0];
                  *(undefined4 *)((long)&paVar27->z + lVar28) =
                       *(undefined4 *)((long)pp_Var4 + lVar28 + 8);
                  *(undefined8 *)((long)&paVar27->x + lVar28) =
                       *(undefined8 *)((long)pp_Var4 + lVar28);
                  uVar50 = uVar50 + 1;
                  lVar28 = lVar28 + 0xc;
                } while (uVar50 < paVar20->mNumVertices);
              }
              if (paVar20->mNumFaces != 0) {
                lVar28 = 0;
                uVar50 = 0;
                do {
                  aiFace::operator=((aiFace *)((long)&paVar20->mFaces->mNumIndices + lVar28),
                                    (aiFace *)(*(long *)&p_Var51[4]._M_use_count + lVar28));
                  uVar50 = uVar50 + 1;
                  lVar28 = lVar28 + 0x10;
                  paVar20 = (aiMesh *)local_1000._0_8_;
                } while (uVar50 < *(uint *)(local_1000._0_8_ + 8));
              }
              if (local_f28._M_current == ppaStack_f20) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&pvStack_f30,local_f28,
                           (aiMesh **)&local_1000);
              }
              else {
                *local_f28._M_current = paVar20;
                local_f28._M_current = local_f28._M_current + 1;
              }
            }
            uVar49 = uVar49 + 1;
          } while (uVar49 < (ulong)(((long)(local_ea0._8_8_ - local_ea0._0_8_) >> 5) *
                                   -0x5555555555555555));
        }
        local_840 = ((long)local_f28._M_current - (long)pvStack_f30 >> 3) - local_848;
        std::vector<SIBObject,_std::allocator<SIBObject>_>::push_back
                  (&vStack_f00,(value_type *)local_c90);
        std::vector<TempMesh,_std::allocator<TempMesh>_>::~vector
                  ((vector<TempMesh,_std::allocator<TempMesh>_> *)local_ea0);
        SIBMesh::~SIBMesh((SIBMesh *)local_db0);
      }
      else if (local_ea8._0_4_ != 0x54455850) goto LAB_0061ea45;
      StreamReader<false,_false>::SetPtr
                (&local_ff0,
                 (int8_t *)
                 ((ulong)(uint)((int)local_ff0.limit - (int)local_ff0.buffer) +
                 CONCAT44(local_ff0.buffer._4_4_,(int)local_ff0.buffer)));
      StreamReader<false,_false>::SetReadLimit(&local_ff0,local_e6c);
    } while (((int)local_ff0.limit - (int)local_ff0.current & 0xfffffff8U) != 0);
  }
  lVar28 = (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                 super__Vector_impl_data._M_start;
  std::vector<SIBObject,std::allocator<SIBObject>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<SIBObject*,std::vector<SIBObject,std::allocator<SIBObject>>>>
            ((vector<SIBObject,std::allocator<SIBObject>> *)&vStack_f00,
             vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
             super__Vector_impl_data._M_finish);
  __src = local_f48;
  if (local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  uVar43 = (long)iStack_f40._M_current - (long)local_f48;
  uVar16 = (uint)(uVar43 >> 3);
  local_f80->mNumMaterials = uVar16;
  uVar50 = (long)local_f28._M_current - (long)pvStack_f30;
  uVar18 = (uint)(uVar50 >> 3);
  local_f80->mNumMeshes = uVar18;
  uVar49 = (long)iStack_f10._M_current - (long)local_f18;
  uVar44 = (uint)(uVar49 >> 3);
  local_f80->mNumLights = uVar44;
  if (uVar16 == 0) {
    __dest = (aiMaterial **)0x0;
  }
  else {
    __dest = (aiMaterial **)operator_new__(uVar43 & 0x7fffffff8);
  }
  local_f80->mMaterials = __dest;
  if (uVar18 == 0) {
    ppaVar29 = (aiMesh **)0x0;
  }
  else {
    ppaVar29 = (aiMesh **)operator_new__(uVar50 & 0x7fffffff8);
  }
  local_f80->mMeshes = ppaVar29;
  if (uVar44 == 0) {
    ppaVar30 = (aiLight **)0x0;
  }
  else {
    ppaVar30 = (aiLight **)operator_new__(uVar49 & 0x7fffffff8);
  }
  local_f80->mLights = ppaVar30;
  if (uVar16 != 0) {
    memcpy(__dest,__src,uVar43 & 0x7fffffff8);
  }
  paVar7 = local_f80;
  if ((ulong)local_f80->mNumMeshes != 0) {
    memcpy(local_f80->mMeshes,pvStack_f30,(ulong)local_f80->mNumMeshes << 3);
  }
  if ((ulong)paVar7->mNumLights != 0) {
    memcpy(paVar7->mLights,local_f18,(ulong)paVar7->mNumLights << 3);
  }
  this_02 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_02);
  (this_02->mName).length = 9;
  builtin_strncpy((this_02->mName).data,"<SIBRoot>",10);
  lVar47 = ((long)iStack_f10._M_current - (long)local_f18 >> 3) +
           ((long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * 0x3aef6ca970586723;
  uVar44 = (uint)lVar47;
  this_02->mNumChildren = uVar44;
  if (uVar44 == 0) {
    ppaVar31 = (aiNode **)0x0;
  }
  else {
    ppaVar31 = (aiNode **)operator_new__(lVar47 * 8 & 0x7fffffff8);
  }
  this_02->mChildren = ppaVar31;
  paVar7->mRootNode = this_02;
  if (vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar43 = 0;
  }
  else {
    uVar43 = 0;
    do {
      pSVar8 = vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (this_02->mChildren == (aiNode **)0x0) {
        __assert_fail("root->mChildren",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SIB/SIBImporter.cpp"
                      ,0x38e,
                      "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      paVar32 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar32);
      paVar37 = (aiNode *)(pSVar8 + uVar43);
      this_02->mChildren[uVar43] = paVar32;
      if (paVar32 != paVar37) {
        uVar44 = (paVar37->mName).length;
        (paVar32->mName).length = uVar44;
        memcpy((paVar32->mName).data,(paVar37->mName).data,(ulong)uVar44);
        (paVar32->mName).data[uVar44] = '\0';
      }
      paVar32->mParent = this_02;
      fVar52 = (paVar37->mTransformation).a2;
      fVar53 = (paVar37->mTransformation).a3;
      fVar54 = (paVar37->mTransformation).a4;
      fVar55 = (paVar37->mTransformation).b1;
      fVar56 = (paVar37->mTransformation).b2;
      fVar57 = (paVar37->mTransformation).b3;
      fVar58 = (paVar37->mTransformation).b4;
      fVar59 = (paVar37->mTransformation).c1;
      fVar60 = (paVar37->mTransformation).c2;
      fVar61 = (paVar37->mTransformation).c3;
      fVar62 = (paVar37->mTransformation).c4;
      fVar63 = (paVar37->mTransformation).d1;
      fVar64 = (paVar37->mTransformation).d2;
      fVar65 = (paVar37->mTransformation).d3;
      fVar66 = (paVar37->mTransformation).d4;
      (paVar32->mTransformation).a1 = (paVar37->mTransformation).a1;
      (paVar32->mTransformation).a2 = fVar52;
      (paVar32->mTransformation).a3 = fVar53;
      (paVar32->mTransformation).a4 = fVar54;
      (paVar32->mTransformation).b1 = fVar55;
      (paVar32->mTransformation).b2 = fVar56;
      (paVar32->mTransformation).b3 = fVar57;
      (paVar32->mTransformation).b4 = fVar58;
      (paVar32->mTransformation).c1 = fVar59;
      (paVar32->mTransformation).c2 = fVar60;
      (paVar32->mTransformation).c3 = fVar61;
      (paVar32->mTransformation).c4 = fVar62;
      (paVar32->mTransformation).d1 = fVar63;
      (paVar32->mTransformation).d2 = fVar64;
      (paVar32->mTransformation).d3 = fVar65;
      (paVar32->mTransformation).d4 = fVar66;
      uVar49 = *(ulong *)&paVar37->mNumChildren;
      uVar44 = (uint)uVar49;
      paVar32->mNumMeshes = uVar44;
      if (uVar44 == 0) {
        puVar33 = (uint *)0x0;
      }
      else {
        puVar33 = (uint *)operator_new__((uVar49 & 0xffffffff) << 2);
      }
      paVar32->mMeshes = puVar33;
      if (paVar32->mNumMeshes != 0) {
        uVar49 = 0;
        do {
          paVar32->mMeshes[uVar49] = *(int *)&paVar37->mParent + (int)uVar49;
          uVar49 = uVar49 + 1;
        } while (uVar49 < paVar32->mNumMeshes);
      }
      if ((ulong)((lVar28 >> 3) * 0x3aef6ca970586723) <= uVar43) {
        paVar34 = (aiMetadata *)operator_new(0x18);
        paVar34->mKeys = (aiString *)0x0;
        paVar34->mValues = (aiMetadataEntry *)0x0;
        paVar34->mNumProperties = 1;
        paVar35 = (aiString *)operator_new__(0x404);
        paVar35->length = 0;
        paVar35->data[0] = '\0';
        memset(paVar35->data + 1,0x1b,0x3ff);
        paVar34->mKeys = paVar35;
        uVar49 = (ulong)paVar34->mNumProperties << 4;
        __s = (aiMetadataEntry *)operator_new__(uVar49);
        memset(__s,0,uVar49);
        paVar34->mValues = __s;
        paVar32->mMetaData = paVar34;
        _local_c90 = (pointer)local_c80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c90,"IsInstance","");
        _Var14._M_pi = local_c88._M_pi;
        if ((paVar34->mNumProperties != 0) &&
           (local_c88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          if (local_c88._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400) {
            paVar35 = paVar34->mKeys;
            paVar35->length = (ai_uint32)local_c88._M_pi;
            memcpy(paVar35->data,_local_c90,(size_t)local_c88._M_pi);
            paVar35->data[(long)_Var14._M_pi] = '\0';
          }
          paVar34->mValues->mType = AI_BOOL;
          puVar36 = (undefined1 *)operator_new(1);
          *puVar36 = 1;
          paVar34->mValues->mData = puVar36;
        }
        if ((aiVector3t<float> *)_local_c90 != local_c80) {
          operator_delete(_local_c90);
        }
      }
      uVar43 = uVar43 + 1;
    } while (uVar43 < (ulong)(((long)vStack_f00.
                                     super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)vStack_f00.
                                     super__Vector_base<SIBObject,_std::allocator<SIBObject>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x3aef6ca970586723));
  }
  if (iStack_f10._M_current != local_f18) {
    uVar49 = 0;
    do {
      if (this_02->mChildren == (aiNode **)0x0) {
        __assert_fail("root->mChildren",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/SIB/SIBImporter.cpp"
                      ,0x3a7,
                      "virtual void Assimp::SIBImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      paVar32 = (aiNode *)local_f18[uVar49];
      if (paVar32 != (aiNode *)0x0) {
        paVar37 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar37);
        this_02->mChildren[uVar43] = paVar37;
        if (paVar37 != paVar32) {
          uVar44 = (paVar32->mName).length;
          (paVar37->mName).length = uVar44;
          memcpy((paVar37->mName).data,(paVar32->mName).data,(ulong)uVar44);
          (paVar37->mName).data[uVar44] = '\0';
        }
        uVar43 = uVar43 + 1;
        paVar37->mParent = this_02;
      }
      uVar49 = uVar49 + 1;
    } while (uVar49 < (ulong)((long)iStack_f10._M_current - (long)local_f18 >> 3));
  }
  if (local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ee8.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_f00.super__Vector_base<SIBObject,_std::allocator<SIBObject>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f18 != (aiLight **)0x0) {
    operator_delete(local_f18);
  }
  if (pvStack_f30 != (void *)0x0) {
    operator_delete(pvStack_f30);
  }
  if (local_f48 != (void *)0x0) {
    operator_delete(local_f48);
  }
  StreamReader<false,_false>::~StreamReader(&local_ff0);
  return;
}

Assistant:

void SIBImporter::InternReadFile(const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile, "rb"));

    // We should have at least one chunk
    if (stream.GetRemainingSize() < 16)
        throw DeadlyImportError("SIB file is either empty or corrupt: " + pFile);

    SIB sib;

    // Default material.
    aiMaterial* defmtl = new aiMaterial;
    aiString defname = aiString(AI_DEFAULT_MATERIAL_NAME);
    defmtl->AddProperty(&defname, AI_MATKEY_NAME);
    sib.mtls.push_back(defmtl);

    // Read it all.
    ReadScene(&sib, &stream);

    // Join the instances and objects together.
    size_t firstInst = sib.objs.size();
    sib.objs.insert(sib.objs.end(), sib.insts.begin(), sib.insts.end());
    sib.insts.clear();

    // Transfer to the aiScene.
    pScene->mNumMaterials = static_cast<unsigned int>(sib.mtls.size());
    pScene->mNumMeshes = static_cast<unsigned int>(sib.meshes.size());
    pScene->mNumLights = static_cast<unsigned int>(sib.lights.size());
    pScene->mMaterials = pScene->mNumMaterials ? new aiMaterial*[pScene->mNumMaterials] : NULL;
    pScene->mMeshes = pScene->mNumMeshes ? new aiMesh*[pScene->mNumMeshes] : NULL;
    pScene->mLights = pScene->mNumLights ? new aiLight*[pScene->mNumLights] : NULL;
    if (pScene->mNumMaterials)
        memcpy(pScene->mMaterials, &sib.mtls[0], sizeof(aiMaterial*) * pScene->mNumMaterials);
    if (pScene->mNumMeshes)
        memcpy(pScene->mMeshes, &sib.meshes[0], sizeof(aiMesh*) * pScene->mNumMeshes);
    if (pScene->mNumLights)
        memcpy(pScene->mLights, &sib.lights[0], sizeof(aiLight*) * pScene->mNumLights);

    // Construct the root node.
    size_t childIdx = 0;
    aiNode *root = new aiNode();
    root->mName.Set("<SIBRoot>");
    root->mNumChildren = static_cast<unsigned int>(sib.objs.size() + sib.lights.size());
    root->mChildren = root->mNumChildren ? new aiNode*[root->mNumChildren] : NULL;
    pScene->mRootNode = root;

    // Add nodes for each object.
    for (size_t n=0;n<sib.objs.size();n++)
    {
        ai_assert(root->mChildren);
        SIBObject& obj = sib.objs[n];
        aiNode* node = new aiNode;
        root->mChildren[childIdx++] = node;
        node->mName = obj.name;
        node->mParent = root;
        node->mTransformation = obj.axis;

        node->mNumMeshes = static_cast<unsigned int>(obj.meshCount);
        node->mMeshes = node->mNumMeshes ? new unsigned[node->mNumMeshes] : NULL;
        for (unsigned i=0;i<node->mNumMeshes;i++)
            node->mMeshes[i] = static_cast<unsigned int>(obj.meshIdx + i);

        // Mark instanced objects as being so.
        if (n >= firstInst)
        {
            node->mMetaData = aiMetadata::Alloc( 1 );
            node->mMetaData->Set( 0, "IsInstance", true );
        }
    }

    // Add nodes for each light.
    // (no transformation as the light is already in world space)
    for (size_t n=0;n<sib.lights.size();n++)
    {
        ai_assert(root->mChildren);
        aiLight* light = sib.lights[n];
        if ( nullptr != light ) {
            aiNode* node = new aiNode;
            root->mChildren[ childIdx++ ] = node;
            node->mName = light->mName;
            node->mParent = root;
        }
    }
}